

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O3

type cm::operator<(char **l,String *r)

{
  char *__s;
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  difference_type __diff;
  ulong uVar4;
  
  __s = *l;
  sVar3 = strlen(__s);
  uVar1 = (r->view_)._M_len;
  uVar4 = uVar1;
  if (sVar3 < uVar1) {
    uVar4 = sVar3;
  }
  if (uVar4 != 0) {
    uVar2 = memcmp(__s,(r->view_)._M_str,uVar4);
    uVar4 = (ulong)uVar2;
    if (uVar2 != 0) goto LAB_0018e854;
  }
  uVar4 = 0xffffffff80000000;
  if (-0x80000000 < (long)(sVar3 - uVar1)) {
    uVar4 = sVar3 - uVar1;
  }
  if (0x7ffffffe < (long)uVar4) {
    uVar4 = 0;
  }
LAB_0018e854:
  return (type)((byte)(uVar4 >> 0x1f) & 1);
}

Assistant:

typename std::enable_if<IsComparable<L>::value, bool>::type operator<(
  L&& l, const String& r)
{
  return AsStringView<L>::view(std::forward<L>(l)) < r.view();
}